

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_linux_alsa.c
# Opt level: O2

PaError PaAlsaStreamComponent_RegisterChannels
                  (PaAlsaStreamComponent *self,PaUtilBufferProcessor *bp,unsigned_long *numFrames,
                  int *xrun)

{
  uint uVar1;
  snd_pcm_t *psVar2;
  undefined8 uVar3;
  unsigned_long uVar4;
  int iVar5;
  uint uVar6;
  pthread_t __thread1;
  char *errorText;
  int iVar7;
  long lVar8;
  ulong uVar9;
  PaError PVar10;
  code *pcVar11;
  void *pvVar12;
  ulong uVar13;
  int *piVar14;
  long lVar15;
  undefined8 uStack_60;
  unsigned_long local_58;
  unsigned_long framesAvail;
  int *local_48;
  snd_pcm_channel_area_t *local_40;
  snd_pcm_channel_area_t *areas;
  
  if (self->streamDir == StreamDirection_In) {
    pcVar11 = PaUtil_SetInputChannel;
  }
  else {
    pcVar11 = PaUtil_SetOutputChannel;
  }
  uStack_60 = 0x111bb8;
  areas = (snd_pcm_channel_area_t *)bp;
  paUtilErr_ = PaAlsaStreamComponent_GetAvailableFrames(self,&local_58,xrun);
  if (paUtilErr_ < 0) {
    uStack_60 = 0x111df4;
    PaUtil_DebugPrint(
                     "Expression \'PaAlsaStreamComponent_GetAvailableFrames( self, &framesAvail, xrun )\' failed in \'/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 3969\n"
                     );
    PVar10 = paUtilErr_;
  }
  else if (*xrun == 0) {
    if (self->canMmap == 0) {
      iVar5 = self->numHostChannels;
      uStack_60 = 0x111c16;
      iVar7 = snd_pcm_format_size(self->nativeFormat,*numFrames);
      uVar6 = iVar7 * iVar5;
      if (self->nonMmapBufferSize < uVar6) {
        self->nonMmapBufferSize = uVar6;
        uStack_60 = 0x111c2e;
        pvVar12 = realloc(self->nonMmapBuffer,(ulong)uVar6);
        self->nonMmapBuffer = pvVar12;
        if (pvVar12 == (void *)0x0) {
          return -0x2708;
        }
      }
    }
    else {
      uStack_60 = 0x111bf4;
      iVar5 = snd_pcm_mmap_begin(self->pcm,&local_40,&self->offset,numFrames);
      if (iVar5 < 0) {
        uStack_60 = 0x111e04;
        __thread1 = pthread_self();
        uStack_60 = 0x111e16;
        iVar7 = pthread_equal(__thread1,paUnixMainThread);
        if (iVar7 != 0) {
          uStack_60 = 0x111e24;
          errorText = (char *)snd_strerror(iVar5);
          uStack_60 = 0x111e32;
          PaUtil_SetLastHostErrorInfo(paALSA,(long)iVar5,errorText);
        }
        uStack_60 = 0x111e40;
        PaUtil_DebugPrint(
                         "Expression \'alsa_snd_pcm_mmap_begin( self->pcm, &areas, &self->offset, numFrames )\' failed in \'/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 3978\n"
                         );
        return -9999;
      }
      self->channelAreas = local_40;
    }
    framesAvail = (unsigned_long)numFrames;
    local_48 = xrun;
    if (self->hostInterleaved == 0) {
      if (self->canMmap == 0) {
        uVar6 = self->nonMmapBufferSize;
        uVar1 = self->numHostChannels;
        pvVar12 = self->nonMmapBuffer;
        for (iVar5 = 0; iVar5 < self->numUserChannels; iVar5 = iVar5 + 1) {
          uStack_60 = 0x111d19;
          (*pcVar11)(areas,iVar5,pvVar12,1);
          pvVar12 = (void *)((long)pvVar12 + (ulong)uVar6 / (ulong)uVar1);
        }
      }
      else {
        lVar15 = 0xc;
        uStack_60 = 1;
        for (uVar13 = 0; (long)uVar13 < (long)self->numUserChannels; uVar13 = uVar13 + 1) {
          uStack_60 = 0x111cc1;
          (*pcVar11)(areas,uVar13 & 0xffffffff,
                     ((ulong)*(uint *)((long)&local_40->addr + lVar15) * self->offset +
                      (ulong)*(uint *)((long)local_40 + lVar15 + -4) >> 3) +
                     *(long *)((long)local_40 + lVar15 + -0xc),1);
          lVar15 = lVar15 + 0x10;
        }
      }
    }
    else {
      uStack_60 = 0x111c56;
      iVar5 = snd_pcm_format_size(self->nativeFormat,1);
      if (self->canMmap == 0) {
        pvVar12 = self->nonMmapBuffer;
      }
      else {
        pvVar12 = (void *)(((ulong)local_40->step * self->offset + (ulong)local_40->first >> 3) +
                          (long)local_40->addr);
      }
      for (iVar7 = 0; iVar7 < self->numUserChannels; iVar7 = iVar7 + 1) {
        uStack_60 = 0x111ce9;
        (*pcVar11)(areas,iVar7,pvVar12,self->numHostChannels);
        pvVar12 = (void *)((long)pvVar12 + (long)iVar5);
      }
    }
    piVar14 = local_48;
    uVar4 = framesAvail;
    PVar10 = 0;
    if ((self->canMmap == 0) && (self->streamDir == StreamDirection_In)) {
      if (self->hostInterleaved == 0) {
        lVar15 = -((ulong)(uint)self->numHostChannels * 8 + 0xf & 0xfffffffffffffff0);
        lVar8 = (long)&local_58 + lVar15;
        uVar6 = self->nonMmapBufferSize;
        uVar1 = self->numHostChannels;
        uVar9 = 0;
        pvVar12 = self->nonMmapBuffer;
        uVar13 = (ulong)uVar1;
        if ((int)uVar1 < 1) {
          uVar13 = uVar9;
        }
        for (; uVar13 != uVar9; uVar9 = uVar9 + 1) {
          *(void **)(lVar8 + uVar9 * 8) = pvVar12;
          pvVar12 = (void *)((long)pvVar12 + (ulong)uVar6 / (ulong)uVar1);
        }
        psVar2 = self->pcm;
        uVar3 = *(undefined8 *)uVar4;
        *(undefined8 *)((long)&uStack_60 + lVar15) = 0x111dbb;
        iVar5 = snd_pcm_readn(psVar2,lVar8,uVar3);
      }
      else {
        uStack_60 = 0x111d55;
        iVar5 = snd_pcm_readi(self->pcm,self->nonMmapBuffer,*(undefined8 *)framesAvail);
        piVar14 = local_48;
      }
      if ((iVar5 == -0x20) || (iVar5 == -0x56)) {
        *piVar14 = 1;
        *(undefined8 *)uVar4 = 0;
      }
    }
  }
  else {
    *numFrames = 0;
    PVar10 = 0;
  }
  return PVar10;
}

Assistant:

static PaError PaAlsaStreamComponent_RegisterChannels( PaAlsaStreamComponent* self, PaUtilBufferProcessor* bp,
        unsigned long* numFrames, int* xrun )
{
    PaError result = paNoError;
    const snd_pcm_channel_area_t *areas, *area;
    void (*setChannel)(PaUtilBufferProcessor *, unsigned int, void *, unsigned int) =
        StreamDirection_In == self->streamDir ? PaUtil_SetInputChannel : PaUtil_SetOutputChannel;
    unsigned char *buffer, *p;
    int i;
    unsigned long framesAvail;

    /* This _must_ be called before mmap_begin */
    PA_ENSURE( PaAlsaStreamComponent_GetAvailableFrames( self, &framesAvail, xrun ) );
    if( *xrun )
    {
        *numFrames = 0;
        goto end;
    }

    if( self->canMmap )
    {
        ENSURE_( alsa_snd_pcm_mmap_begin( self->pcm, &areas, &self->offset, numFrames ), paUnanticipatedHostError );
        /* @concern ChannelAdaption Buffer address is recorded so we can do some channel adaption later */
        self->channelAreas = (snd_pcm_channel_area_t *)areas;
    }
    else
    {
        unsigned int bufferSize = self->numHostChannels * alsa_snd_pcm_format_size( self->nativeFormat, *numFrames );
        if( bufferSize > self->nonMmapBufferSize )
        {
            self->nonMmapBuffer = realloc( self->nonMmapBuffer, ( self->nonMmapBufferSize = bufferSize ) );
            if( !self->nonMmapBuffer )
            {
                result = paInsufficientMemory;
                goto error;
            }
        }
    }

    if( self->hostInterleaved )
    {
        int swidth = alsa_snd_pcm_format_size( self->nativeFormat, 1 );

        p = buffer = self->canMmap ? ExtractAddress( areas, self->offset ) : self->nonMmapBuffer;
        for( i = 0; i < self->numUserChannels; ++i )
        {
            /* We're setting the channels up to userChannels, but the stride will be hostChannels samples */
            setChannel( bp, i, p, self->numHostChannels );
            p += swidth;
        }
    }
    else
    {
        if( self->canMmap )
        {
            for( i = 0; i < self->numUserChannels; ++i )
            {
                area = areas + i;
                buffer = ExtractAddress( area, self->offset );
                setChannel( bp, i, buffer, 1 );
            }
        }
        else
        {
            unsigned int buf_per_ch_size = self->nonMmapBufferSize / self->numHostChannels;
            buffer = self->nonMmapBuffer;
            for( i = 0; i < self->numUserChannels; ++i )
            {
                setChannel( bp, i, buffer, 1 );
                buffer += buf_per_ch_size;
            }
        }
    }

    if( !self->canMmap && StreamDirection_In == self->streamDir )
    {
        /* Read sound */
        int res;
        if( self->hostInterleaved )
            res = alsa_snd_pcm_readi( self->pcm, self->nonMmapBuffer, *numFrames );
        else
        {
            void *bufs[self->numHostChannels];
            unsigned int buf_per_ch_size = self->nonMmapBufferSize / self->numHostChannels;
            unsigned char *buffer = self->nonMmapBuffer;
            int i;
            for( i = 0; i < self->numHostChannels; ++i )
            {
                bufs[i] = buffer;
                buffer += buf_per_ch_size;
            }
            res = alsa_snd_pcm_readn( self->pcm, bufs, *numFrames );
        }
        if( res == -EPIPE || res == -ESTRPIPE )
        {
            *xrun = 1;
            *numFrames = 0;
        }
    }

end:
error:
    return result;
}